

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack27_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar12 [32];
  
  uVar2 = *in;
  auVar7 = *(undefined1 (*) [16])(in + 1);
  auVar1 = *(undefined1 (*) [16])(in + 7);
  auVar6 = vpmovsxbd_avx(ZEXT416(0x1010401));
  uVar3 = in[0xd];
  auVar5 = vpsllvd_avx2(auVar7,_DAT_0019e160);
  auVar5 = vpand_avx(auVar5,_DAT_0019e170);
  *out = uVar2 & 0x7ffffff;
  auVar8 = valignd_avx512vl(ZEXT1632(auVar7),ZEXT1632(auVar7),7);
  auVar8 = vpblendd_avx2(auVar8,ZEXT432(uVar2),1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(in + 5);
  auVar7 = vpshufd_avx(auVar14,0x40);
  auVar6 = vpermi2d_avx512vl(auVar6,auVar14,auVar1);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_0019e180);
  auVar11._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar8._0_16_;
  auVar11._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar7;
  auVar7._8_8_ = 0x7ffff0007fffff8;
  auVar7._0_8_ = 0x7ffff0007fffff8;
  auVar7 = vpandq_avx512vl(auVar6,auVar7);
  auVar9 = vpbroadcastd_avx512vl();
  auVar8 = vpblendd_avx2(auVar8,auVar11,0xe0);
  auVar10._8_4_ = 0x7ffffff;
  auVar10._0_8_ = 0x7ffffff07ffffff;
  auVar10._12_4_ = 0x7ffffff;
  auVar12._16_4_ = 0x7ffffff;
  auVar12._0_16_ = auVar10;
  auVar12._20_4_ = 0x7ffffff;
  auVar12._24_4_ = 0x7ffffff;
  auVar12._28_4_ = 0x7ffffff;
  auVar11 = vpsrlvd_avx2(auVar8,_DAT_0019aee0);
  auVar15._0_8_ = auVar7._0_8_;
  auVar15._8_8_ = auVar15._0_8_;
  auVar15._16_8_ = auVar15._0_8_;
  auVar15._24_8_ = auVar15._0_8_;
  auVar8 = vpblendd_avx2(ZEXT1632(auVar5),auVar12,0x20);
  auVar8 = vpblendd_avx2(auVar8,auVar9,0x10);
  auVar8 = vpblendd_avx2(auVar8,auVar15,0xc0);
  auVar5 = vpinsrd_avx(auVar10,(in[8] & 0x3fff) << 0xd,0);
  uVar4 = *(ulong *)(in + 0xb);
  auVar9 = vpor_avx2(auVar11,auVar8);
  auVar8 = vpand_avx2(auVar11,auVar12);
  auVar8 = vpblendd_avx2(auVar9,auVar8,0x20);
  auVar13._8_8_ = *(undefined8 *)(in + 9);
  auVar13._0_8_ = *(undefined8 *)(in + 9);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar6 = vpsrlvd_avx2(auVar1,_DAT_001aaa90);
  auVar7 = vpshufd_avx(auVar13,0x50);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001aaaa0);
  auVar7 = vpand_avx(auVar7,_DAT_001aaab0);
  auVar7 = vpblendd_avx2(auVar7,auVar5,1);
  auVar5 = vpor_avx(auVar6,auVar7);
  auVar7 = vpand_avx(auVar6,auVar10);
  auVar7 = vpblendd_avx2(auVar5,auVar7,8);
  *(undefined1 (*) [16])(out + 9) = auVar7;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar4;
  auVar7 = vpalignr_avx(auVar6,auVar1,0xc);
  auVar1 = vpsrlvd_avx2(auVar7,_DAT_001aaac0);
  auVar7 = vpsllvd_avx2(auVar6,_DAT_0019fb80);
  auVar5._8_8_ = 0x7ffffc007fffffe;
  auVar5._0_8_ = 0x7ffffc007fffffe;
  auVar7 = vpternlogq_avx512vl(auVar7,auVar1,auVar5,0xec);
  *(long *)(out + 0xd) = auVar7._0_8_;
  out[0xf] = (uVar3 & 0xffff) << 0xb | (uint)(uVar4 >> 0x35);
  return in + 0xe;
}

Assistant:

const uint32_t *__fastunpack27_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 19)) << (27 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 14)) << (27 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 9)) << (27 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 4)) << (27 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 27);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 26)) << (27 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 21)) << (27 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 16)) << (27 - 16);
  out++;

  return in + 1;
}